

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
          (QHash<QByteArray,QByteArray> *this,QByteArray *key,QByteArray *args)

{
  Data *pDVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_38.d = (Data *)0x0;
LAB_00128c38:
    QHash<QByteArray,_QByteArray>::detach((QHash<QByteArray,_QByteArray> *)this);
    pVar3 = (piter)emplace_helper<QByteArray_const&>(this,key,args);
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)&local_38);
  }
  else {
    if (1 < (uint)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
      local_38.d = pDVar1;
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00128c38;
    }
    uVar2._0_4_ = pDVar1[1].super_QArrayData.ref_;
    uVar2._4_4_ = pDVar1[1].super_QArrayData.flags;
    if ((ulong)(pDVar1->super_QArrayData).alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QByteArray_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_00128cbe;
    }
    local_38.d = (args->d).d;
    local_38.ptr = (args->d).ptr;
    local_38.size = (args->d).size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar3 = (piter)QHash<QByteArray,_QByteArray>::emplace_helper<QByteArray>
                             ((QHash<QByteArray,_QByteArray> *)this,key,(QByteArray *)&local_38);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00128cbe:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }